

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetItemAttributes
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          uint32 index,PropertyAttributes attributes)

{
  JavascriptLibrary *pJVar1;
  IndexPropertyDescriptorMap *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_58 [3];
  DynamicObject *local_40;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  
  bVar3 = IndexPropertyDescriptorMap::TryGetReference((this->indexPropertyMap).ptr,index,&local_38);
  if (bVar3) {
    if ((local_38->Attributes & 8) != 0) {
      return 0;
    }
    bVar3 = DynamicObject::GetHasNoEnumerableProperties((DynamicObject *)arr);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x224,"(!arr->GetHasNoEnumerableProperties())",
                                  "!arr->GetHasNoEnumerableProperties()");
      if (!bVar3) {
LAB_00c427cf:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    local_38->Attributes = attributes & 7 | local_38->Attributes & 0xf8;
    if ((attributes & 4) != 0) {
      return 1;
    }
    DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
    if (((this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags &
        0x20) == 0) {
      return 1;
    }
    pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  }
  else {
    BVar4 = HasDataItem(this,arr,index);
    if (BVar4 == 0) {
      return 0;
    }
    local_40 = instance;
    bVar3 = DynamicObject::GetHasNoEnumerableProperties((DynamicObject *)arr);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x234,"(!arr->GetHasNoEnumerableProperties())",
                                  "!arr->GetHasNoEnumerableProperties()");
      if (!bVar3) goto LAB_00c427cf;
      *puVar5 = 0;
    }
    this_00 = (this->indexPropertyMap).ptr;
    IndexPropertyDescriptor::IndexPropertyDescriptor
              ((IndexPropertyDescriptor *)local_58,attributes & 7,(Var)0x0,(Var)0x0);
    IndexPropertyDescriptorMap::Add(this_00,index,(IndexPropertyDescriptor *)local_58);
    if ((attributes & 4) != 0) {
      return 1;
    }
    DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
    if (((this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.flags &
        0x20) == 0) {
      return 1;
    }
    pJVar1 = (((local_40->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  }
  Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::WriteBarrierSet
            ((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *)local_58,
             &pJVar1->typesWithOnlyWritablePropertyProtoChain);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_58[0]);
  return 1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetItemAttributes(ES5Array* arr, DynamicObject* instance, uint32 index, PropertyAttributes attributes)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            // No need to change hasNoEnumerableProperties. See comment in ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes.
            Assert(!arr->GetHasNoEnumerableProperties());

            descriptor->Attributes = (descriptor->Attributes & ~PropertyDynamicTypeDefaults) | (attributes & PropertyDynamicTypeDefaults);
            if (!(descriptor->Attributes & PropertyWritable))
            {
                this->ClearHasOnlyWritableDataProperties();
                if(this->GetFlags() & this->IsPrototypeFlag)
                {
                    instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                }
            }
            return true;
        }
        else if (HasDataItem(arr, index))
        {
            // No need to change hasNoEnumerableProperties. See comment in ES5ArrayTypeHandlerBase<T>::SetItemWithAttributes.
            Assert(!arr->GetHasNoEnumerableProperties());

            indexPropertyMap->Add(index, IndexPropertyDescriptor(attributes & PropertyDynamicTypeDefaults));
            if (!(attributes & PropertyWritable))
            {
                this->ClearHasOnlyWritableDataProperties();
                if(this->GetFlags() & this->IsPrototypeFlag)
                {
                    instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                }
            }
            return true;
        }

        return false;
    }